

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srv_state.hxx
# Opt level: O2

ptr<buffer> __thiscall nuraft::srv_state::serialize_v1p(srv_state *this,size_t version)

{
  uint8_t in_DL;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<buffer> pVar1;
  buffer_serializer bs;
  
  buffer::alloc((buffer *)this,0xe);
  buffer_serializer::buffer_serializer(&bs,(ptr<buffer> *)this,LITTLE);
  buffer_serializer::put_u8(&bs,in_DL);
  buffer_serializer::put_u64(&bs,*(uint64_t *)(version + 8));
  buffer_serializer::put_i32(&bs,*(int32_t *)(version + 0x10));
  buffer_serializer::put_u8(&bs,*(byte *)(version + 0x14) & 1);
  pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (ptr<buffer>)pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<buffer> serialize_v1p(size_t version) const {
        //   << Format >>
        // version          1 byte
        // term             8 bytes
        // voted_for        4 bytes
        // election timer   1 byte
        ptr<buffer> buf = buffer::alloc( sizeof(uint8_t) +
                                         sizeof(uint64_t) +
                                         sizeof(int32_t) +
                                         sizeof(uint8_t) );
        buffer_serializer bs(buf);
        bs.put_u8(version);
        bs.put_u64(term_);
        bs.put_i32(voted_for_);
        bs.put_u8( election_timer_allowed_ ? 1 : 0 );
        return buf;
    }